

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * lest::to_hex_string_abi_cxx11_(char c)

{
  ostream *poVar1;
  byte in_SIL;
  string *in_RDI;
  ostringstream os;
  string local_1c0 [34];
  char local_19e;
  char local_19d;
  int local_19c;
  int local_198;
  ostringstream local_188 [383];
  byte local_9;
  
  local_9 = in_SIL;
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"\\x");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
  local_19c = (int)std::setw(2);
  local_198 = local_19c;
  poVar1 = std::operator<<(poVar1,(_Setw)local_19c);
  local_19e = (char)std::setfill<char>('0');
  local_19d = local_19e;
  poVar1 = std::operator<<(poVar1,local_19e);
  std::ostream::operator<<(poVar1,(uint)local_9);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string(in_RDI,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

inline std::string to_hex_string(char c)
{
    std::ostringstream os;
    os << "\\x" << std::hex << std::setw(2) << std::setfill('0') << static_cast<int>( static_cast<unsigned char>(c) );
    return os.str();
}